

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint in_ESI;
  ImDrawList *in_RDI;
  float fVar4;
  bool push_clip_rect;
  float r_surface;
  ImRect r;
  bool was_accepted_previously;
  ImGuiPayload *payload;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  byte bVar5;
  ImDrawList *this;
  char *in_stack_ffffffffffffff58;
  ImGuiPayload *in_stack_ffffffffffffff60;
  ImVec2 *this_00;
  undefined1 intersect_with_current_clip_rect;
  undefined4 in_stack_ffffffffffffff70;
  ImVec2 cr_max;
  ImVec2 cr_min;
  undefined1 local_6c [8];
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  byte local_49;
  float local_48;
  ImRect local_44;
  byte local_31;
  ImGuiWindow *pIVar6;
  ImGuiContext *p_max;
  undefined4 in_stack_ffffffffffffffe8;
  ImGuiPayload *local_8;
  
  pIVar6 = GImGui->CurrentWindow;
  local_8 = &GImGui->DragDropPayload;
  p_max = GImGui;
  if ((in_RDI == (ImDrawList *)0x0) ||
     (bVar1 = ImGuiPayload::IsDataType(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58), bVar1))
  {
    local_31 = p_max->DragDropAcceptIdPrev == p_max->DragDropTargetId;
    local_44.Min = (p_max->DragDropTargetRect).Min;
    local_44.Max = (p_max->DragDropTargetRect).Max;
    fVar4 = ImRect::GetWidth(&local_44);
    local_48 = ImRect::GetHeight(&local_44);
    local_48 = fVar4 * local_48;
    if (local_48 <= p_max->DragDropAcceptIdCurrRectSurface) {
      p_max->DragDropAcceptFlags = in_ESI;
      p_max->DragDropAcceptIdCurr = p_max->DragDropTargetId;
      p_max->DragDropAcceptIdCurrRectSurface = local_48;
    }
    local_8->Preview = (bool)(local_31 & 1);
    uVar2 = p_max->DragDropSourceFlags & 0x800;
    uVar3 = uVar2 | in_ESI;
    if ((uVar2 == 0 && (in_ESI & 0x800) == 0) && ((local_8->Preview & 1U) != 0)) {
      ImRect::Expand(&local_44,3.5);
      bVar1 = ImRect::Contains(&pIVar6->ClipRect,&local_44);
      local_49 = (bVar1 ^ 0xffU) & 1;
      if (local_49 != 0) {
        this_00 = &local_5c;
        fVar4 = 1.0;
        ImVec2::ImVec2(this_00,1.0,1.0);
        intersect_with_current_clip_rect = (undefined1)((ulong)this_00 >> 0x38);
        local_54 = operator-((ImVec2 *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
                             ,(ImVec2 *)0x14465f);
        cr_max = (ImVec2)&local_44.Max;
        cr_min = (ImVec2)local_6c;
        ImVec2::ImVec2((ImVec2 *)cr_min,fVar4,fVar4);
        local_64 = operator+((ImVec2 *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
                             ,(ImVec2 *)0x144696);
        ImDrawList::PushClipRect
                  ((ImDrawList *)CONCAT44(fVar4,in_stack_ffffffffffffff70),cr_min,cr_max,
                   (bool)intersect_with_current_clip_rect);
      }
      this = pIVar6->DrawList;
      GetColorU32((ImGuiCol)((ulong)&local_44.Max >> 0x20),SUB84(&local_44.Max,0));
      ImDrawList::AddRect(in_RDI,(ImVec2 *)CONCAT44(uVar3,in_stack_ffffffffffffffe8),(ImVec2 *)p_max
                          ,(ImU32)((ulong)pIVar6 >> 0x20),SUB84(pIVar6,0),
                          (ImDrawCornerFlags)((ulong)local_8 >> 0x20),SUB84(local_8,0));
      if ((local_49 & 1) != 0) {
        ImDrawList::PopClipRect(this);
      }
    }
    p_max->DragDropAcceptFrameCount = p_max->FrameCount;
    bVar5 = 0;
    if ((local_31 & 1) != 0) {
      bVar1 = IsMouseDown(p_max->DragDropMouseButton);
      bVar5 = bVar1 ^ 0xff;
    }
    local_8->Delivery = (bool)(bVar5 & 1);
    if (((local_8->Delivery & 1U) == 0) && ((uVar3 & 0x400) == 0)) {
      local_8 = (ImGuiPayload *)0x0;
    }
  }
  else {
    local_8 = (ImGuiPayload *)0x0;
  }
  return local_8;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface <= g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
    {
        // FIXME-DRAG: Settle on a proper default visuals for drop target.
        r.Expand(3.5f);
        bool push_clip_rect = !window->ClipRect.Contains(r);
        if (push_clip_rect) window->DrawList->PushClipRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1));
        window->DrawList->AddRect(r.Min, r.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, ~0, 2.0f);
        if (push_clip_rect) window->DrawList->PopClipRect();
    }

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}